

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

void __thiscall Arcflow::final_compression_step(Arcflow *this)

{
  NodeSet *this_00;
  pointer ppVar1;
  pointer pvVar2;
  int iVar3;
  int iVar4;
  int *v;
  long lVar5;
  runtime_error *prVar6;
  pointer ppVar7;
  long lVar8;
  long lVar9;
  allocator_type local_1d1;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> lbl;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  adj;
  NodeSet NStmp;
  vector<int,_std::allocator<int>_> order;
  
  if (this->ready != false) {
    snprintf((char *)&order,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x17e);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,(char *)&order);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = &this->NS;
  iVar3 = NodeSet::size(this_00);
  std::vector<int,_std::allocator<int>_>::vector(&labels,(long)iVar3,(allocator_type *)&order);
  get_adj(&adj,iVar3,&this->A,true);
  NStmp.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &NStmp.index._M_t._M_impl.super__Rb_tree_header._M_header;
  NStmp.index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  NStmp.index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  NStmp.index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  NStmp.labels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  NStmp.labels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  NStmp.labels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = 0;
  NStmp.index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       NStmp.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    iVar3 = NodeSet::size(this_00);
    if (iVar3 <= lVar9) {
      NodeSet::operator=(this_00,&NStmp);
      NodeSet::topological_order(&order,this_00);
      for (; labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start !=
             labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
          labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1) {
        *labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = *(int *)(CONCAT44(order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._4_4_,
                                      order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_) +
                            (long)*labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start * 4);
      }
      relabel_graph(this,&labels);
      NodeSet::sort(this_00);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&order.super__Vector_base<int,_std::allocator<int>_>);
      NodeSet::~NodeSet(&NStmp);
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~vector(&adj);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&labels.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&lbl,(long)this->label_size,
               (value_type *)&order.super__Vector_base<int,_std::allocator<int>_>,&local_1d1);
    ppVar1 = adj.
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar9].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar7 = adj.
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar9].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar1; ppVar7 = ppVar7 + 1) {
      if (lVar9 <= ppVar7->first) {
        snprintf((char *)&order,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "pa.first < u",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,0x187);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,(char *)&order);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar3 = ppVar7->second;
      NodeSet::get_label((vector<int,_std::allocator<int>_> *)
                         &order.super__Vector_base<int,_std::allocator<int>_>,&NStmp,
                         labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[ppVar7->first]);
      pvVar2 = (this->weights).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar8 = 0; lVar5 = (long)(this->inst).ndims, lVar8 < lVar5; lVar8 = lVar8 + 1) {
        iVar4 = *(int *)(*(long *)&pvVar2[iVar3].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + lVar8 * 4) +
                *(int *)(CONCAT44(order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + lVar8 * 4);
        if (iVar4 < lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8]) {
          iVar4 = lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar8];
        }
        lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar8] = iVar4;
      }
      if ((this->inst).binary != false) {
        if (iVar3 == this->LOSS) {
          iVar3 = *(int *)(CONCAT44(order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_) + lVar5 * 4);
          if (iVar3 < lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5]) {
            iVar3 = lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5];
          }
        }
        else {
          iVar4 = *(int *)(CONCAT44(order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_) + lVar5 * 4);
          if (iVar3 < iVar4) {
            iVar3 = iVar4;
          }
          if (iVar3 < lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5]) {
            iVar3 = lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5];
          }
        }
        lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar5] = iVar3;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&order.super__Vector_base<int,_std::allocator<int>_>);
    }
    iVar3 = NodeSet::get_index(&NStmp,(vector<int,_std::allocator<int>_> *)
                                      &lbl.super__Vector_base<int,_std::allocator<int>_>);
    labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar9] = iVar3;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&lbl.super__Vector_base<int,_std::allocator<int>_>);
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void Arcflow::final_compression_step() {
	throw_assert(ready == false);
	int nv = NS.size();
	std::vector<int> labels(nv);
	std::vector<std::vector<int_pair>> adj = get_adj(nv, A, TRANSPOSE);

	NodeSet NStmp;
	for (int u = 0; u < NS.size(); u++) {
		std::vector<int> lbl(label_size, 0);
		for (const auto &pa : adj[u]) {
			throw_assert(pa.first < u);
			int v = labels[pa.first];
			int it = pa.second;
			const std::vector<int> &lv = NStmp.get_label(v);
			for (int d = 0; d < inst.ndims; d++) {
				lbl[d] = std::max(lbl[d], lv[d] + weights[it][d]);
			}
			if (inst.binary) {
				if (it == LOSS) {
					lbl[inst.ndims] = std::max(lbl[inst.ndims],
											   lv[inst.ndims]);
				} else {
					lbl[inst.ndims] = std::max(lbl[inst.ndims],
											   std::max(lv[inst.ndims], it));
				}
			}
		}
		labels[u] = NStmp.get_index(lbl);
	}

	NS = NStmp;
	std::vector<int> order = NS.topological_order();
	for (int &v : labels) {
		v = order[v];
	}
	relabel_graph(labels);
	NS.sort();
}